

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::WithFunctionClauseSyntax::setChild
          (WithFunctionClauseSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  Token TVar2;
  
  if (index == 0) {
    TVar2 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    (this->with).kind = TVar2.kind;
    (this->with).field_0x2 = TVar2._2_1_;
    (this->with).numFlags = (NumericTokenFlags)TVar2.numFlags.raw;
    (this->with).rawLen = TVar2.rawLen;
    (this->with).info = TVar2.info;
  }
  else {
    pSVar1 = TokenOrSyntax::node(&child);
    if (pSVar1 == (SyntaxNode *)0x0) {
      pSVar1 = (SyntaxNode *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node(&child);
    }
    (this->name).ptr = (NameSyntax *)pSVar1;
  }
  return;
}

Assistant:

void WithFunctionClauseSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: with = child.token(); return;
        case 1: name = child.node() ? &child.node()->as<NameSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}